

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

shared_ptr<GenApi_3_4::CNodeMapRef> __thiscall rcg::Device::getRemoteNodeMap(Device *this,char *xml)

{
  bool bVar1;
  GC_ERROR GVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<GenApi_3_4::CNodeMapRef> sVar4;
  lock_guard<std::mutex> lock;
  char *in_stack_00000d10;
  CPort *in_stack_00000d18;
  void *in_stack_00000d20;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000d28;
  CPort *in_stack_ffffffffffffff38;
  __shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff40;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffff48;
  CPort *in_stack_ffffffffffffff50;
  CPort local_40 [2];
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff40,
             (mutex_type *)in_stack_ffffffffffffff38);
  if ((*(long *)(in_RSI + 0x80) != 0) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0xf8)), !bVar1)) {
    peVar3 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11f314);
    GVar2 = (*peVar3->DevGetPort)(*(DEV_HANDLE *)(in_RSI + 0x80),(PORT_HANDLE *)(in_RSI + 0x88));
    if (GVar2 == 0) {
      operator_new(0x20);
      std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
                ((shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff40,
                 (shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff38);
      CPort::CPort(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   &in_stack_ffffffffffffff40->_M_ptr);
      std::shared_ptr<rcg::CPort>::shared_ptr<rcg::CPort,void>
                ((shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff40 =
           (__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xd8);
      in_stack_ffffffffffffff38 = local_40;
      std::shared_ptr<rcg::CPort>::operator=
                ((shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff40,
                 (shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff38);
      std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x11f3d2);
      std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
                ((shared_ptr<const_rcg::GenTLWrapper> *)0x11f3dc);
      std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
                ((shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff40,
                 (shared_ptr<const_rcg::GenTLWrapper> *)in_stack_ffffffffffffff38);
      std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::get(in_stack_ffffffffffffff40);
      allocNodeMap(in_stack_00000d28,in_stack_00000d20,in_stack_00000d18,in_stack_00000d10);
      std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff40,
                 (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff38);
      std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x11f450);
      std::shared_ptr<const_rcg::GenTLWrapper>::~shared_ptr
                ((shared_ptr<const_rcg::GenTLWrapper> *)0x11f45a);
    }
  }
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff40,
             (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff38);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11f4ed);
  sVar4.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<GenApi_3_4::CNodeMapRef>)
         sVar4.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CNodeMapRef> Device::getRemoteNodeMap(const char *xml)
{
  std::lock_guard<std::mutex> lock(mtx);

  if (dev != 0 && !rnodemap)
  {
    if (gentl->DevGetPort(dev, &rp) == GenTL::GC_ERR_SUCCESS)
    {
      rport=std::shared_ptr<CPort>(new CPort(gentl, &rp));
      rnodemap=allocNodeMap(gentl, rp, rport.get(), xml);
    }
  }

  return rnodemap;
}